

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

void __thiscall FastRandomContext::FastRandomContext(FastRandomContext *this,uint256 *seed)

{
  long lVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_RandomMixin<FastRandomContext>).bitbuf = 0;
  (this->super_RandomMixin<FastRandomContext>).bitbuf_size = 0;
  (this->super_RandomMixin<FastRandomContext>).field_0xc = 0;
  key.m_size = 0x20;
  key.m_data = (byte *)seed;
  ChaCha20Aligned::ChaCha20Aligned(&(this->rng).m_aligned,key);
  (this->rng).m_bufleft = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FastRandomContext::FastRandomContext(const uint256& seed) noexcept : requires_seed(false), rng(MakeByteSpan(seed)) {}